

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# monitor.c
# Opt level: O0

GLFWbool refreshVideoModes(_GLFWmonitor *monitor)

{
  GLFWvidmode *__base;
  GLFWvidmode *modes;
  _GLFWmonitor *p_Stack_18;
  int modeCount;
  _GLFWmonitor *monitor_local;
  
  if (monitor->modes == (GLFWvidmode *)0x0) {
    p_Stack_18 = monitor;
    __base = _glfwPlatformGetVideoModes(monitor,(int *)((long)&modes + 4));
    if (__base == (GLFWvidmode *)0x0) {
      monitor_local._4_4_ = 0;
    }
    else {
      qsort(__base,(long)modes._4_4_,0x18,compareVideoModes);
      free(p_Stack_18->modes);
      p_Stack_18->modes = __base;
      p_Stack_18->modeCount = modes._4_4_;
      monitor_local._4_4_ = 1;
    }
  }
  else {
    monitor_local._4_4_ = 1;
  }
  return monitor_local._4_4_;
}

Assistant:

static GLFWbool refreshVideoModes(_GLFWmonitor* monitor)
{
    int modeCount;
    GLFWvidmode* modes;

    if (monitor->modes)
        return GLFW_TRUE;

    modes = _glfwPlatformGetVideoModes(monitor, &modeCount);
    if (!modes)
        return GLFW_FALSE;

    qsort(modes, modeCount, sizeof(GLFWvidmode), compareVideoModes);

    free(monitor->modes);
    monitor->modes = modes;
    monitor->modeCount = modeCount;

    return GLFW_TRUE;
}